

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O3

void zero_derivative(vw *all)

{
  uint32_t uVar1;
  _Hash_node_base *p_Var2;
  weight *pwVar3;
  
  if ((all->weights).sparse == true) {
    for (p_Var2 = (all->weights).sparse_weights._map._M_h._M_before_begin._M_nxt;
        p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
      *(undefined4 *)((long)&(p_Var2[2]._M_nxt)->_M_nxt + 4) = 0;
    }
  }
  else {
    pwVar3 = (all->weights).dense_weights._begin;
    if (pwVar3 != pwVar3 + (all->weights).dense_weights._weight_mask + 1) {
      uVar1 = (all->weights).dense_weights._stride_shift;
      do {
        pwVar3[1] = 0.0;
        pwVar3 = pwVar3 + (1L << ((byte)uVar1 & 0x3f));
      } while (pwVar3 != (all->weights).dense_weights._begin +
                         (all->weights).dense_weights._weight_mask + 1);
    }
  }
  return;
}

Assistant:

inline void set_zero(size_t offset)
  {
    if (sparse)
      sparse_weights.set_zero(offset);
    else
      dense_weights.set_zero(offset);
  }